

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O2

int strbin(char *str)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  byte *pbVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  
  iVar3 = (int)str;
  pbVar4 = (byte *)str;
  do {
    while( true ) {
      pbVar5 = pbVar4 + 1;
      bVar6 = *pbVar4;
      if (bVar6 == 0x5c) break;
      if (bVar6 == 0) {
        *str = 0;
        return (int)str - iVar3;
      }
      *str = bVar6;
      str = (char *)((byte *)str + 1);
      pbVar4 = pbVar5;
    }
    bVar6 = *pbVar5;
    if (bVar6 - 0x30 < 8) {
      bVar6 = 0;
      for (lVar9 = 0; pbVar7 = pbVar4 + 4, (int)lVar9 != 3; lVar9 = lVar9 + 1) {
        bVar6 = bVar6 * '\b';
        if ((pbVar4[lVar9 + 1] & 0xf8) != 0x30) {
          pbVar7 = pbVar4 + lVar9;
          break;
        }
        bVar6 = (pbVar4[lVar9 + 1] + bVar6) - 0x30;
      }
      goto switchD_0037849c_caseD_64;
    }
    pbVar7 = pbVar5;
    switch(bVar6) {
    case 0x6e:
      bVar6 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
      break;
    case 0x72:
      bVar6 = 0xd;
      break;
    case 0x74:
      bVar6 = 9;
      break;
    case 0x76:
      bVar6 = 0xb;
      break;
    case 0x78:
switchD_003784de_caseD_78:
      bVar6 = 0;
      iVar8 = 2;
      while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, pbVar7 = pbVar4 + 3, bVar10) {
        bVar1 = pbVar5[1];
        cVar2 = -0x30;
        if (((9 < (byte)(bVar1 - 0x30)) && (cVar2 = -0x57, 5 < (byte)(bVar1 + 0x9f))) &&
           (cVar2 = -0x37, pbVar7 = pbVar5, 5 < (byte)(bVar1 + 0xbf))) break;
        pbVar5 = pbVar5 + 1;
        bVar6 = bVar6 * '\x10' + cVar2 + bVar1;
      }
      break;
    default:
      switch(bVar6) {
      case 0x61:
        bVar6 = 7;
        break;
      case 0x62:
        bVar6 = 8;
        break;
      case 99:
        bVar6 = 0x1c;
        break;
      case 100:
      case 0x65:
        break;
      case 0x66:
        bVar6 = 0xc;
        break;
      default:
        if (bVar6 != 10) {
          if ((bVar6 != 0x3f) && (bVar6 == 0x58)) goto switchD_003784de_caseD_78;
          break;
        }
        goto LAB_003784f2;
      }
    }
switchD_0037849c_caseD_64:
    *str = bVar6;
    str = (char *)((byte *)str + 1);
LAB_003784f2:
    pbVar4 = pbVar7 + 1;
  } while( true );
}

Assistant:

int strbin (char *str)
{
	char *start = str;
	char *p = str, c;
	int i;

	while ( (c = *p++) ) {
		if (c != '\\') {
			*str++ = c;
		} else {
			switch (*p) {
				case 'a':
					*str++ = '\a';
					break;
				case 'b':
					*str++ = '\b';
					break;
				case 'c':
					*str++ = '\034';	// TEXTCOLOR_ESCAPE
					break;
				case 'f':
					*str++ = '\f';
					break;
				case 'n':
					*str++ = '\n';
					break;
				case 't':
					*str++ = '\t';
					break;
				case 'r':
					*str++ = '\r';
					break;
				case 'v':
					*str++ = '\v';
					break;
				case '?':
					*str++ = '\?';
					break;
				case '\n':
					break;
				case 'x':
				case 'X':
					c = 0;
					for (i = 0; i < 2; i++)
					{
						p++;
						if (*p >= '0' && *p <= '9')
							c = (c << 4) + *p-'0';
						else if (*p >= 'a' && *p <= 'f')
							c = (c << 4) + 10 + *p-'a';
						else if (*p >= 'A' && *p <= 'F')
							c = (c << 4) + 10 + *p-'A';
						else
						{
							p--;
							break;
						}
					}
					*str++ = c;
					break;
				case '0':
				case '1':
				case '2':
				case '3':
				case '4':
				case '5':
				case '6':
				case '7':
					c = 0;
					for (i = 0; i < 3; i++) {
						c <<= 3;
						if (*p >= '0' && *p <= '7')
							c += *p-'0';
						else
						{
							p--;
							break;
						}
						p++;
					}
					*str++ = c;
					break;
				default:
					*str++ = *p;
					break;
			}
			p++;
		}
	}
	*str = 0;
	return int(str - start);
}